

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall tinyusdz::Stage::replace_root_prim(Stage *this,string *prim_name,Prim *prim)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  string *psVar7;
  reference this_00;
  Value *pVVar8;
  Path *pPVar9;
  allocator local_c81;
  string local_c80;
  Path local_c60;
  string local_b90 [32];
  ostringstream local_b70 [8];
  ostringstream ss_e_5;
  allocator local_9f1;
  string local_9f0;
  Path local_9d0;
  string local_900 [32];
  ostringstream local_8e0 [8];
  ostringstream ss_e_4;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_768;
  anon_class_32_1_a7abcf24_for__M_pred local_760;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_740;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_738;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_730;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  result;
  string local_720 [32];
  ostringstream local_700 [8];
  ostringstream ss_e_3;
  string local_588 [32];
  ostringstream local_568 [8];
  ostringstream ss_e_2;
  ulong local_3f0;
  size_t i;
  allocator local_3c1;
  string local_3c0 [32];
  fmt local_3a0 [32];
  ostringstream local_380 [8];
  ostringstream ss_e_1;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  Prim *prim_local;
  string *prim_name_local;
  Stage *this_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = ValidatePrimElementName(prim_name);
    if (bVar1) {
      sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                        ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
      sVar5 = ::std::
              multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->_root_node_nameSet);
      if (sVar4 != sVar5) {
        ::std::
        multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->_root_node_nameSet);
        for (local_3f0 = 0;
            sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this),
            local_3f0 < sVar4; local_3f0 = local_3f0 + 1) {
          pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                             (&this->_root_nodes,local_3f0);
          Prim::element_name_abi_cxx11_(pvVar6);
          uVar2 = ::std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_568);
            poVar3 = ::std::operator<<((ostream *)local_568,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"replace_root_prim");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2c7);
            ::std::operator<<(poVar3," ");
            poVar3 = ::std::operator<<((ostream *)local_568,
                                       "Internal error: Existing root Prim\'s elementName is empty."
                                      );
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)&this->_err,local_588);
            ::std::__cxx11::string::~string(local_588);
            ::std::__cxx11::ostringstream::~ostringstream(local_568);
            return false;
          }
          pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                             (&this->_root_nodes,local_3f0);
          psVar7 = Prim::element_name_abi_cxx11_(pvVar6);
          sVar5 = ::std::
                  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->_root_node_nameSet,psVar7);
          if (sVar5 != 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_700);
            poVar3 = ::std::operator<<((ostream *)local_700,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"replace_root_prim");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2cb);
            ::std::operator<<(poVar3," ");
            poVar3 = ::std::operator<<((ostream *)local_700,
                                       "Internal error: Stage contains root Prim with same elementName."
                                      );
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)&this->_err,local_720);
            ::std::__cxx11::string::~string(local_720);
            ::std::__cxx11::ostringstream::~ostringstream(local_700);
            return false;
          }
          pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                             (&this->_root_nodes,local_3f0);
          psVar7 = Prim::element_name_abi_cxx11_(pvVar6);
          result._M_current =
               (Prim *)::std::
                       multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::insert(&this->_root_node_nameSet,psVar7);
        }
      }
      local_738._M_current =
           (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
      local_740._M_current =
           (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
      ::std::__cxx11::string::string((string *)&local_760,(string *)prim_name);
      local_730 = ::std::
                  find_if<__gnu_cxx::__normal_iterator<tinyusdz::Prim*,std::vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>>>,tinyusdz::Stage::replace_root_prim(std::__cxx11::string_const&,tinyusdz::Prim&&)::__0>
                            (local_738,local_740,&local_760);
      replace_root_prim(std::__cxx11::string_const&,tinyusdz::Prim&&)::$_0::~__0((__0 *)&local_760);
      local_768._M_current =
           (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
      bVar1 = __gnu_cxx::operator!=(&local_730,&local_768);
      if (bVar1) {
        pVVar8 = Prim::get_data(prim);
        bVar1 = SetPrimElementName(pVVar8,prim_name);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_8e0);
          poVar3 = ::std::operator<<((ostream *)local_8e0,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"replace_root_prim");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2db);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_8e0,
                                     "Internal error. cannot modify Prim\'s elementName.");
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)&this->_err,local_900);
          ::std::__cxx11::string::~string(local_900);
          ::std::__cxx11::ostringstream::~ostringstream(local_8e0);
          return false;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_9f0,"",&local_9f1);
        Path::Path(&local_9d0,prim_name,&local_9f0);
        pPVar9 = Prim::element_path(prim);
        Path::operator=(pPVar9,&local_9d0);
        Path::~Path(&local_9d0);
        ::std::__cxx11::string::~string((string *)&local_9f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
        this_00 = __gnu_cxx::
                  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                  ::operator*(&local_730);
        Prim::operator=(this_00,prim);
      }
      else {
        pVVar8 = Prim::get_data(prim);
        bVar1 = SetPrimElementName(pVVar8,prim_name);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_b70);
          poVar3 = ::std::operator<<((ostream *)local_b70,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"replace_root_prim");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2e5);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_b70,
                                     "Internal error. cannot modify Prim\'s elementName.");
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)&this->_err,local_b90);
          ::std::__cxx11::string::~string(local_b90);
          ::std::__cxx11::ostringstream::~ostringstream(local_b70);
          return false;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_c80,"",&local_c81);
        Path::Path(&local_c60,prim_name,&local_c80);
        pPVar9 = Prim::element_path(prim);
        Path::operator=(pPVar9,&local_c60);
        Path::~Path(&local_c60);
        ::std::__cxx11::string::~string((string *)&local_c80);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c81);
        ::std::
        multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&this->_root_node_nameSet,prim_name);
        ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                  (&this->_root_nodes,prim);
      }
      this->_dirty = true;
      this_local._7_1_ = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_380);
      poVar3 = ::std::operator<<((ostream *)local_380,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"replace_root_prim");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2bf);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3c0,"`{}` is not a valid Prim name.",&local_3c1);
      fmt::format<std::__cxx11::string>
                (local_3a0,(string *)local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prim_name);
      poVar3 = ::std::operator<<((ostream *)local_380,(string *)local_3a0);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_3a0);
      ::std::__cxx11::string::~string(local_3c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)&this->_err,(string *)&i);
      ::std::__cxx11::string::~string((string *)&i);
      this_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_380);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"replace_root_prim");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,699);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1e0,"prim_name is empty.",&local_1e1);
    fmt::format(&local_1c0,&local_1e0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    ::std::__cxx11::ostringstream::str();
    ::std::__cxx11::string::operator+=((string *)&this->_err,local_208);
    ::std::__cxx11::string::~string(local_208);
    this_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return this_local._7_1_;
}

Assistant:

bool Stage::replace_root_prim(const std::string &prim_name, Prim &&prim) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (prim_name.empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format("prim_name is empty."));
  }

  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN(fmt::format("`{}` is not a valid Prim name.", prim_name));
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_root_nodes.begin(), _root_nodes.end(), [prim_name](const Prim &p) {
    return (p.element_name() == prim_name);
  });

  if (result != _root_nodes.end()) {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    (*result) = std::move(prim); // replace

  } else {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    _root_node_nameSet.insert(prim_name);
    _root_nodes.emplace_back(std::move(prim)); // add
  }

  _dirty = true;

  return true;
}